

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::CalcItemSize(ImVec2 size,float default_w,float default_h)

{
  float fVar1;
  ImVec2 in_XMM0_Qa;
  float in_XMM1_Da;
  float in_XMM2_Da;
  ImVec2 region_max;
  ImGuiWindow *window;
  ImVec2 local_28;
  ImGuiWindow *local_20;
  float local_18;
  float local_14;
  ImVec2 local_10;
  
  local_20 = GImGui->CurrentWindow;
  local_18 = in_XMM2_Da;
  local_14 = in_XMM1_Da;
  local_10 = in_XMM0_Qa;
  ImVec2::ImVec2(&local_28);
  if ((local_10.x < 0.0) || (local_10.y < 0.0)) {
    local_28 = GetContentRegionMaxAbs();
  }
  if ((local_10.x != 0.0) || (NAN(local_10.x))) {
    if (local_10.x < 0.0) {
      fVar1 = ImMax<float>(4.0,(local_28.x - (local_20->DC).CursorPos.x) + local_10.x);
      local_10.x = fVar1;
    }
  }
  else {
    local_10.x = local_14;
  }
  if ((local_10.y != 0.0) || (NAN(local_10.y))) {
    if (local_10.y < 0.0) {
      fVar1 = ImMax<float>(4.0,(local_28.y - (local_20->DC).CursorPos.y) + local_10.y);
      local_10.y = fVar1;
    }
  }
  else {
    local_10.y = local_18;
  }
  return local_10;
}

Assistant:

ImVec2 ImGui::CalcItemSize(ImVec2 size, float default_w, float default_h)
{
    ImGuiWindow* window = GImGui->CurrentWindow;

    ImVec2 region_max;
    if (size.x < 0.0f || size.y < 0.0f)
        region_max = GetContentRegionMaxAbs();

    if (size.x == 0.0f)
        size.x = default_w;
    else if (size.x < 0.0f)
        size.x = ImMax(4.0f, region_max.x - window->DC.CursorPos.x + size.x);

    if (size.y == 0.0f)
        size.y = default_h;
    else if (size.y < 0.0f)
        size.y = ImMax(4.0f, region_max.y - window->DC.CursorPos.y + size.y);

    return size;
}